

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

HierarchicalReference * __thiscall
slang::BumpAllocator::emplace<slang::ast::HierarchicalReference>(BumpAllocator *this)

{
  HierarchicalReference *pHVar1;
  
  pHVar1 = (HierarchicalReference *)allocate(this,0x28,8);
  pHVar1->target = (Symbol *)0x0;
  pHVar1->expr = (Expression *)0x0;
  (pHVar1->path)._M_ptr = (pointer)0x0;
  (pHVar1->path)._M_extent._M_extent_value = 0;
  pHVar1->upwardCount = 0;
  return pHVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }